

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall CVmObjDict::notify_delete(CVmObjDict *this,int param_1)

{
  char *pcVar1;
  CVmHashTable *this_00;
  vmdict_TrieNode *this_01;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (pcVar1 != (char *)0x0) {
    this_00 = *(CVmHashTable **)(pcVar1 + 0x10);
    if (this_00 != (CVmHashTable *)0x0) {
      CVmHashTable::~CVmHashTable(this_00);
      operator_delete(this_00,0x20);
    }
    this_01 = *(vmdict_TrieNode **)((this->super_CVmObject).ext_ + 0x38);
    if (this_01 != (vmdict_TrieNode *)0x0) {
      vmdict_TrieNode::~vmdict_TrieNode(this_01);
      operator_delete(this_01,0x18);
    }
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,(this->super_CVmObject).ext_);
    return;
  }
  return;
}

Assistant:

void CVmObjDict::notify_delete(VMG_ int /*in_root_set*/)
{
    /* free our additional data */
    if (ext_ != 0)
    {
        /* free our hash table */
        if (get_ext()->hashtab_ != 0)
            delete get_ext()->hashtab_;

        /* free our Trie */
        if (get_ext()->trie_ != 0)
            delete get_ext()->trie_;

        /* free the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}